

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O1

void anon_unknown.dwarf_a244b::dump(char *label,cmGccDepfileContent *dfc)

{
  pointer pcVar1;
  pointer pbVar2;
  size_t sVar3;
  ostream *poVar4;
  cmGccStyleDependency *entry;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar6;
  
  if (label == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0xc14760);
  }
  else {
    sVar3 = strlen(label);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,label,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  pcVar1 = (dfc->super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar5 = (dfc->
                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>).
                _M_impl.super__Vector_impl_data._M_start; pcVar5 != pcVar1; pcVar5 = pcVar5 + 1) {
    pbVar6 = (pcVar5->rules).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar6 != (pcVar5->rules).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      while( true ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == (pcVar5->rules).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    pbVar2 = (pcVar5->paths).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (pcVar5->paths).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length)
      ;
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void dump(const char* label, const cmGccDepfileContent& dfc)
{
  std::cerr << label << std::endl;
  for (const auto& entry : dfc) {
    auto rit = entry.rules.cbegin();
    if (rit != entry.rules.cend()) {
      std::cerr << *rit;
      for (++rit; rit != entry.rules.cend(); ++rit) {
        std::cerr << "  " << *rit;
      }
      std::cerr << ": " << std::endl;
    }
    for (const auto& path : entry.paths) {
      std::cerr << "    " << path << std::endl;
    }
  }
}